

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

ErrorStatus ts_parser__version_status(TSParser *self,StackVersion version)

{
  _Bool _Var1;
  TSStateId TVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ErrorStatus EVar7;
  
  uVar3 = ts_stack_error_cost(self->stack,version);
  _Var1 = ts_stack_is_paused(self->stack,version);
  uVar4 = ts_stack_node_count_since_error(self->stack,version);
  uVar5 = ts_stack_dynamic_precedence(self->stack,version);
  uVar6 = 0x100000000;
  if (_Var1) {
    uVar3 = uVar3 + 100;
  }
  else {
    TVar2 = ts_stack_state(self->stack,version);
    if (TVar2 != 0) {
      uVar6 = 0;
    }
  }
  EVar7.node_count = uVar4;
  EVar7.cost = uVar3;
  EVar7._8_8_ = uVar5 | uVar6;
  return EVar7;
}

Assistant:

static ErrorStatus ts_parser__version_status(TSParser *self, StackVersion version) {
  unsigned cost = ts_stack_error_cost(self->stack, version);
  bool is_paused = ts_stack_is_paused(self->stack, version);
  if (is_paused) cost += ERROR_COST_PER_SKIPPED_TREE;
  return (ErrorStatus) {
    .cost = cost,
    .node_count = ts_stack_node_count_since_error(self->stack, version),
    .dynamic_precedence = ts_stack_dynamic_precedence(self->stack, version),
    .is_in_error = is_paused || ts_stack_state(self->stack, version) == ERROR_STATE
  };
}